

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O1

Vec_Int_t * Spl_ManFromWecMapping(Gia_Man_t *p,Vec_Wec_t *vMap)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  if (p->vMapping2 == (Vec_Wec_t *)0x0) {
    __assert_fail("Gia_ManHasMapping2(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x52,"Vec_Int_t *Spl_ManFromWecMapping(Gia_Man_t *, Vec_Wec_t *)");
  }
  uVar1 = p->nObjs;
  lVar3 = (long)vMap->nSize;
  iVar8 = 0;
  iVar7 = 0;
  if (0 < lVar3) {
    lVar6 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + *(int *)((long)&vMap->pArray->nSize + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (lVar3 << 4 != lVar6);
  }
  if (0 < vMap->nSize) {
    lVar6 = 0;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + (uint)(0 < *(int *)((long)&vMap->pArray->nSize + lVar6));
      lVar6 = lVar6 + 0x10;
    } while (lVar3 * 0x10 != lVar6);
    iVar8 = iVar8 * 2;
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < (iVar7 + uVar1 + iVar8) - 1) {
    iVar5 = iVar7 + uVar1 + iVar8;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  p_00->pArray = piVar4;
  if (iVar5 < (int)uVar1) {
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    p_00->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(p_00->pArray,0,(ulong)uVar1 * 4);
  }
  p_00->nSize = uVar1;
  if (0 < vMap->nSize) {
    lVar3 = 0;
    do {
      pVVar2 = vMap->pArray;
      if (0 < pVVar2[lVar3].nSize) {
        if (p_00->nSize <= lVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p_00->pArray[lVar3] = p_00->nSize;
        Vec_IntPush(p_00,pVVar2[lVar3].nSize);
        if (0 < pVVar2[lVar3].nSize) {
          lVar6 = 0;
          do {
            Vec_IntPush(p_00,pVVar2[lVar3].pArray[lVar6]);
            lVar6 = lVar6 + 1;
          } while (lVar6 < pVVar2[lVar3].nSize);
        }
        Vec_IntPush(p_00,(int)lVar3);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < vMap->nSize);
  }
  if ((0xf < p_00->nSize) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntSize(vMapping) < 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x5e,"Vec_Int_t *Spl_ManFromWecMapping(Gia_Man_t *, Vec_Wec_t *)");
  }
  return p_00;
}

Assistant:

Vec_Int_t * Spl_ManFromWecMapping( Gia_Man_t * p, Vec_Wec_t * vMap )
{
    Vec_Int_t * vMapping, * vVec; int i, k, Obj;
    assert( Gia_ManHasMapping2(p) );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p) + Vec_WecSizeSize(vMap) + 2*Vec_WecSizeUsed(vMap) );
    Vec_IntFill( vMapping, Gia_ManObjNum(p), 0 );
    Vec_WecForEachLevel( vMap, vVec, i )
        if ( Vec_IntSize(vVec) > 0 )
        {
            Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
            Vec_IntPush( vMapping, Vec_IntSize(vVec) );
            Vec_IntForEachEntry( vVec, Obj, k )
                Vec_IntPush( vMapping, Obj );
            Vec_IntPush( vMapping, i );
        }
    assert( Vec_IntSize(vMapping) < 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    return vMapping;
}